

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

UCalendarWeekdayType __thiscall
icu_63::Calendar::getDayOfWeekType(Calendar *this,UCalendarDaysOfWeek dayOfWeek,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  UCalendarDaysOfWeek dayOfWeek_local;
  Calendar *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (((int)dayOfWeek < 1) || (7 < (int)dayOfWeek)) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      this_local._4_4_ = UCAL_WEEKDAY;
    }
    else if (this->fWeekendOnset == this->fWeekendCease) {
      if (dayOfWeek == this->fWeekendOnset) {
        this_local._4_4_ = UCAL_WEEKEND_ONSET;
        if (this->fWeekendOnsetMillis == 0) {
          this_local._4_4_ = UCAL_WEEKEND;
        }
      }
      else {
        this_local._4_4_ = UCAL_WEEKDAY;
      }
    }
    else {
      if ((int)this->fWeekendOnset < (int)this->fWeekendCease) {
        if (((int)dayOfWeek < (int)this->fWeekendOnset) ||
           ((int)this->fWeekendCease < (int)dayOfWeek)) {
          return UCAL_WEEKDAY;
        }
      }
      else if (((int)this->fWeekendCease < (int)dayOfWeek) &&
              ((int)dayOfWeek < (int)this->fWeekendOnset)) {
        return UCAL_WEEKDAY;
      }
      if (dayOfWeek == this->fWeekendOnset) {
        this_local._4_4_ = UCAL_WEEKEND_ONSET;
        if (this->fWeekendOnsetMillis == 0) {
          this_local._4_4_ = UCAL_WEEKEND;
        }
      }
      else if (dayOfWeek == this->fWeekendCease) {
        this_local._4_4_ = UCAL_WEEKEND_CEASE;
        if (86399999 < this->fWeekendCeaseMillis) {
          this_local._4_4_ = UCAL_WEEKEND;
        }
      }
      else {
        this_local._4_4_ = UCAL_WEEKEND;
      }
    }
  }
  else {
    this_local._4_4_ = UCAL_WEEKDAY;
  }
  return this_local._4_4_;
}

Assistant:

UCalendarWeekdayType
Calendar::getDayOfWeekType(UCalendarDaysOfWeek dayOfWeek, UErrorCode &status) const
{
    if (U_FAILURE(status)) {
        return UCAL_WEEKDAY;
    }
    if (dayOfWeek < UCAL_SUNDAY || dayOfWeek > UCAL_SATURDAY) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return UCAL_WEEKDAY;
    }
    if (fWeekendOnset == fWeekendCease) {
        if (dayOfWeek != fWeekendOnset)
            return UCAL_WEEKDAY;
        return (fWeekendOnsetMillis == 0) ? UCAL_WEEKEND : UCAL_WEEKEND_ONSET;
    }
    if (fWeekendOnset < fWeekendCease) {
        if (dayOfWeek < fWeekendOnset || dayOfWeek > fWeekendCease) {
            return UCAL_WEEKDAY;
        }
    } else {
        if (dayOfWeek > fWeekendCease && dayOfWeek < fWeekendOnset) {
            return UCAL_WEEKDAY;
        }
    }
    if (dayOfWeek == fWeekendOnset) {
        return (fWeekendOnsetMillis == 0) ? UCAL_WEEKEND : UCAL_WEEKEND_ONSET;
    }
    if (dayOfWeek == fWeekendCease) {
        return (fWeekendCeaseMillis >= 86400000) ? UCAL_WEEKEND : UCAL_WEEKEND_CEASE;
    }
    return UCAL_WEEKEND;
}